

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hak.cpp
# Opt level: O0

Complex __thiscall libDAI::HAK::logZ(HAK *this)

{
  int iVar1;
  _func_int **pp_Var2;
  Region *this_00;
  undefined4 extraout_var;
  _Base_ptr p_Var3;
  FRegion *this_01;
  undefined4 extraout_var_00;
  void *extraout_RDX;
  undefined8 extraout_RDX_00;
  void *extraout_RDX_01;
  _func_int **pp_Var4;
  _Base_ptr p_Var5;
  long *in_RDI;
  double __r;
  size_t sVar6;
  Complex CVar7;
  size_t alpha;
  size_t beta;
  Complex sum;
  complex<double> *in_stack_fffffffffffffec8;
  HAK *in_stack_fffffffffffffed0;
  TFactor<double> *in_stack_ffffffffffffff08;
  undefined1 local_78 [24];
  _Base_ptr local_60;
  _Base_ptr local_58;
  _Base_ptr local_50;
  size_t local_48;
  complex<double> local_40;
  _Base_ptr local_30;
  size_t local_28;
  _func_int **local_20;
  TFactor<double> *in_stack_fffffffffffffff0;
  TFactor<double> *in_stack_fffffffffffffff8;
  
  std::complex<double>::complex((complex<double> *)&stack0xfffffffffffffff0,0.0,0.0);
  local_20 = (_func_int **)0x0;
  while( true ) {
    pp_Var4 = local_20;
    (**(code **)(*in_RDI + 0x20))();
    pp_Var2 = (_func_int **)RegionGraph::nr_IRs((RegionGraph *)0xb4c3dd);
    if (pp_Var2 <= pp_Var4) break;
    (**(code **)(*in_RDI + 0x20))();
    pp_Var4 = local_20;
    this_00 = RegionGraph::IR((RegionGraph *)in_stack_fffffffffffffed0,
                              (long)in_stack_fffffffffffffec8);
    iVar1 = Region::c(this_00,pp_Var4,extraout_RDX);
    p_Var5 = *(_Base_ptr *)CONCAT44(extraout_var,iVar1);
    sVar6 = 0;
    std::complex<double>::complex(&local_40,(double)p_Var5,0.0);
    Qb(in_stack_fffffffffffffed0,(size_t)in_stack_fffffffffffffec8);
    TFactor<double>::entropy((TFactor<double> *)0xb4c440);
    local_50 = p_Var5;
    local_48 = sVar6;
    std::operator*(in_stack_fffffffffffffec8,(complex<double> *)0xb4c467);
    local_30 = p_Var5;
    local_28 = sVar6;
    std::complex<double>::operator+=
              ((complex<double> *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    local_20 = (_func_int **)((long)local_20 + 1);
  }
  local_58 = (_Base_ptr)0x0;
  while( true ) {
    p_Var5 = local_58;
    (**(code **)(*in_RDI + 0x20))();
    p_Var3 = (_Base_ptr)RegionGraph::nr_ORs((RegionGraph *)0xb4c4d3);
    if (p_Var3 <= p_Var5) break;
    (**(code **)(*in_RDI + 0x20))();
    p_Var5 = local_58;
    this_01 = RegionGraph::OR((RegionGraph *)in_stack_fffffffffffffed0,
                              (long)in_stack_fffffffffffffec8);
    iVar1 = FRegion::c(this_01,p_Var5,extraout_RDX_01);
    __r = *(double *)CONCAT44(extraout_var_00,iVar1);
    in_stack_fffffffffffffed0 = (HAK *)local_78;
    p_Var5 = (_Base_ptr)0x0;
    std::complex<double>::complex((complex<double> *)in_stack_fffffffffffffed0,__r,0.0);
    Qa(in_stack_fffffffffffffed0,(size_t)in_stack_fffffffffffffec8);
    TFactor<double>::entropy((TFactor<double> *)0xb4c53e);
    std::operator*(in_stack_fffffffffffffec8,(complex<double> *)0xb4c562);
    local_78._16_8_ = __r;
    local_60 = p_Var5;
    std::complex<double>::operator+=
              ((complex<double> *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
    (**(code **)(*in_RDI + 0x20))();
    RegionGraph::OR((RegionGraph *)in_stack_fffffffffffffed0,(long)in_stack_fffffffffffffec8);
    TFactor<double>::log0(in_stack_ffffffffffffff08);
    Qa(in_stack_fffffffffffffed0,(size_t)in_stack_fffffffffffffec8);
    TFactor<double>::operator*(in_stack_fffffffffffffff8,in_stack_fffffffffffffff0);
    in_stack_fffffffffffffec8 =
         (complex<double> *)TFactor<double>::totalSum((TFactor<double> *)0xb4c5ed);
    std::complex<double>::operator+=
              ((complex<double> *)&stack0xfffffffffffffff0,(double)in_stack_fffffffffffffec8);
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffed0);
    TFactor<double>::~TFactor((TFactor<double> *)in_stack_fffffffffffffed0);
    local_58 = (_Base_ptr)((long)&local_58->_M_color + 1);
  }
  CVar7._M_value._8_8_ = extraout_RDX_00;
  CVar7._M_value._0_8_ = p_Var5;
  return (Complex)CVar7._M_value;
}

Assistant:

Complex HAK::logZ() const {
        Complex sum = 0.0;
        for( size_t beta = 0; beta < grm().nr_IRs(); beta++ )
            sum += Complex(grm().IR(beta).c()) * Qb(beta).entropy();
        for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ ) {
            sum += Complex(grm().OR(alpha).c()) * Qa(alpha).entropy();
            sum += (grm().OR(alpha).log0() * Qa(alpha)).totalSum();
        }
        return sum;
    }